

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  void *pvVar1;
  istream *piVar2;
  ulong *puVar3;
  void *__s;
  long lVar4;
  ostream *poVar5;
  ulong __n;
  long lVar6;
  int b;
  int a;
  size_t k;
  int n;
  int local_40;
  int local_3c;
  long local_38;
  int local_2c;
  
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_2c);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&local_3c);
  puVar3 = (ulong *)std::istream::operator>>(piVar2,&local_40);
  std::istream::_M_extract<unsigned_long>(puVar3);
  lVar6 = (long)local_2c;
  __n = 0xffffffffffffffff;
  if (-1 < lVar6) {
    __n = lVar6 * 4;
  }
  __s = operator_new__(__n);
  memset(__s,0,__n);
  if (0 < lVar6) {
    lVar4 = 0;
    do {
      *(int *)((long)__s + lVar4 * 4) = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar6 != lVar4);
  }
  pvVar1 = (void *)((long)__s + (long)local_3c * 4);
  std::_V2::__rotate<int*>
            (pvVar1,(void *)((long)pvVar1 + local_38 * 4),(void *)((long)__s + (long)local_40 * 4));
  if (local_2c != 0) {
    lVar4 = 0;
    do {
      poVar5 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)__s + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      lVar4 = lVar4 + 4;
    } while (lVar6 * 4 - lVar4 != 0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  operator_delete__(__s);
  return 0;
}

Assistant:

int main() {
  int n,a,b;
  size_t k;
  cin >> n >> a >> b >> k;
  CP::vector<int> v(n);
  for (int i = 0;i < n;i++) v[i] = i;
  v.rotate(v.begin() + a, v.begin() + b,k);
  for (auto &x : v) cout << x << " ";
  cout << endl;
}